

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,PromiseClient *this
          ,uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,
          CallHints hints)

{
  ClientHook *pCVar1;
  Maybe<capnp::MessageSize> local_38;
  char local_20 [8];
  uint64_t local_18;
  undefined8 uStack_10;
  
  if (this->isResolved == true) {
    pCVar1 = (this->cap).ptr;
    local_20[0] = (sizeHint->ptr).isSet;
    if ((bool)local_20[0] == true) {
      local_18 = (sizeHint->ptr).field_1.value.wordCount;
      uStack_10 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (**pCVar1->_vptr_ClientHook)(__return_storage_ptr__,pCVar1,interfaceId,methodId,local_20);
  }
  else {
    this->receivedCall = true;
    local_38.ptr.isSet = (sizeHint->ptr).isSet;
    if (local_38.ptr.isSet == true) {
      local_38.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
      local_38.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    RpcClient::newCall(__return_storage_ptr__,&this->super_RpcClient,interfaceId,methodId,&local_38,
                       hints);
  }
  return __return_storage_ptr__;
}

Assistant:

newCall(
        uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
        CallHints hints) override {
      if (isResolved) {
        // Go directly to the resolved capability.
        //
        // If we don't do this now, then we'll return an RpcRequest which, as soon as send() is
        // called, may discover that it's not sending to an RPC capability after all, and will
        // just have to call `newCall()` on the inner capability at that point and copy the request
        // over. Better to redirect now and avoid the copy later.
        return cap->newCall(interfaceId, methodId, sizeHint, hints);
      }

      receivedCall = true;

      // IMPORTANT: We must call our superclass's version of newCall(), NOT cap->newCall(), because
      //   the Request object we create needs to check at send() time whether the promise has
      //   resolved and, if so, redirect to the new target.
      return RpcClient::newCall(interfaceId, methodId, sizeHint, hints);
    }